

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int flattenSubquery(Parse *pParse,Select *p,int iFrom,int isAgg)

{
  SrcList **ppSVar1;
  u8 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  sqlite3 *db;
  char *pcVar9;
  SrcList *pSVar10;
  ExprList *pEVar11;
  Subquery *p_00;
  Table *pTVar12;
  SrcList *pSVar13;
  Select *pSVar14;
  bool bVar15;
  u32 uVar16;
  int iVar17;
  Select *pSVar18;
  SrcList *pSVar19;
  Expr *pEVar20;
  long lVar21;
  anon_union_4_2_6146edf4_for_u *paVar22;
  Select *pSVar23;
  ulong uVar24;
  undefined8 *puVar25;
  Parse *pParse_00;
  Select *pSVar26;
  undefined8 *puVar27;
  int iVar28;
  SrcItem *pSVar29;
  long lVar30;
  long in_FS_OFFSET;
  byte bVar31;
  SubstContext x;
  Walker w;
  int *local_120;
  Select *local_118;
  Select *local_e0;
  int local_cc;
  SubstContext local_98;
  undefined1 local_68 [32];
  undefined1 *local_48;
  anon_union_8_18_67db040d_for_u aStack_40;
  long local_38;
  
  bVar31 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  pcVar9 = pParse->zAuthContext;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_40.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iVar28 = 0;
  iVar17 = 0;
  if (((db->dbOptFlags & 1) != 0) || (iVar17 = iVar28, p->pWin != (Window *)0x0)) goto LAB_00189d9f;
  pSVar10 = p->pSrc;
  pSVar26 = (pSVar10->a[iFrom].u4.pSubq)->pSelect;
  if (pSVar26->pWin != (Window *)0x0) goto LAB_00189d9f;
  iVar28 = pSVar10->a[iFrom].iCursor;
  pSVar19 = pSVar26->pSrc;
  pEVar20 = pSVar26->pLimit;
  if (((((pEVar20 != (Expr *)0x0) &&
        ((p->pLimit != (Expr *)0x0 || ((pEVar20 != (Expr *)0x0 && (pEVar20->pRight != (Expr *)0x0)))
         ))) || (uVar7 = p->selFlags, (pEVar20 != (Expr *)0x0 & (byte)(uVar7 >> 8) & 1) != 0)) ||
      ((((pSVar19->nSrc == 0 || (uVar8 = pSVar26->selFlags, (uVar8 & 1) != 0)) ||
        ((pEVar20 != (Expr *)0x0 && ((isAgg != 0 || (1 < pSVar10->nSrc)))))) ||
       ((pEVar11 = p->pOrderBy, pEVar11 != (ExprList *)0x0 && (pSVar26->pOrderBy != (ExprList *)0x0)
        ))))) || ((isAgg != 0 && (pSVar26->pOrderBy != (ExprList *)0x0)))) goto LAB_00189d9f;
  if (pEVar20 == (Expr *)0x0) {
    if ((uVar8 >> 0xd & 1) != 0) goto LAB_00189d9f;
  }
  else if ((p->pWhere != (Expr *)0x0) ||
          ((uVar7 & 1) != 0 && pEVar20 != (Expr *)0x0 || (uVar8 >> 0xd & 1) != 0))
  goto LAB_00189d9f;
  pSVar29 = pSVar10->a + iFrom;
  bVar4 = pSVar10->a[iFrom].fg.jointype;
  if ((bVar4 & 0x60) == 0) {
    local_cc = 0;
  }
  else {
    iVar17 = 0;
    if (((1 < pSVar19->nSrc) || ((pSVar19->a[0].pSTab)->eTabType == '\x01')) ||
       (iVar17 = 0, (bVar4 & 0x10) != 0 || (uVar7 & 1) != 0)) goto LAB_00189d9f;
    local_cc = 1;
  }
  if ((0 < iFrom) && (iVar17 = 0, (pSVar19->a[0].fg.jointype & 0x40) != 0)) goto LAB_00189d9f;
  if (pSVar26->pPrior != (Select *)0x0) {
    if (isAgg == 0) {
      local_120 = (int *)0x0;
      bVar15 = false;
      if (pSVar26->pOrderBy != (ExprList *)0x0) goto LAB_00189f8f;
      pSVar18 = pSVar26;
      if ((uVar7 & 1) == 0 && (bVar4 & 0x60) == 0) {
        do {
          if (pSVar18 == (Select *)0x0) {
            if ((pEVar11 == (ExprList *)0x0) || ((long)pEVar11->nExpr < 1)) goto LAB_0018a22f;
            lVar30 = 0;
            goto LAB_0018a21a;
          }
        } while (((((pSVar18->selFlags & 9) == 0) &&
                  ((pSVar14 = pSVar18->pPrior, pSVar14 == (Select *)0x0 || (pSVar18->op == 0x88))))
                 && (ppSVar1 = &pSVar18->pSrc, 0 < (*ppSVar1)->nSrc)) &&
                ((pSVar18->pWin == (Window *)0x0 &&
                 ((pSVar18 = pSVar14, iFrom < 1 || (((*ppSVar1)->a[0].fg.jointype & 0x40) == 0))))))
        ;
      }
    }
    goto LAB_00189f84;
  }
  local_120 = (int *)0x0;
  goto LAB_00189fa2;
  while (lVar30 = lVar30 + 0x18, (long)pEVar11->nExpr * 0x18 != lVar30) {
LAB_0018a21a:
    if (*(short *)((long)&pEVar11->a[0].u + lVar30) == 0) goto LAB_00189f84;
  }
LAB_0018a22f:
  if (((uVar7 >> 0xd & 1) == 0) && (iVar17 = compoundHasDifferentAffinities(pSVar26), iVar17 == 0))
  {
    if (pSVar10->nSrc < 2) {
LAB_0018a6a1:
      local_120 = (int *)0x0;
    }
    else {
      if ((500 < pParse->nSelect) || ((db->dbOptFlags & 0x800000) != 0)) goto LAB_00189f84;
      local_120 = (int *)sqlite3DbMallocZero(db,(long)pParse->nTab * 4 + 4);
      if (local_120 == (int *)0x0) goto LAB_0018a6a1;
      *local_120 = pParse->nTab;
    }
    bVar15 = true;
  }
  else {
LAB_00189f84:
    local_120 = (int *)0x0;
    bVar15 = false;
  }
LAB_00189f8f:
  iVar17 = 0;
  if (!bVar15) goto LAB_00189d9f;
LAB_00189fa2:
  pParse->zAuthContext = pSVar29->zName;
  local_e0 = (Select *)0x0;
  sqlite3AuthCheck(pParse,0x15,(char *)0x0,(char *)0x0,(char *)0x0);
  pParse->zAuthContext = pcVar9;
  if ((pSVar10->a[iFrom].fg.field_0x1 & 4) != 0) {
    p_00 = pSVar10->a[iFrom].u4.pSubq;
    local_e0 = p_00->pSelect;
    sqlite3DbFreeNN(db,p_00);
    pSVar10->a[iFrom].u4.pSchema = (Schema *)0x0;
    puVar3 = &pSVar10->a[iFrom].fg.field_0x1;
    *puVar3 = *puVar3 & 0xfb;
  }
  if (pSVar29->zName != (char *)0x0) {
    sqlite3DbFreeNN(db,pSVar29->zName);
  }
  pcVar9 = pSVar10->a[iFrom].zAlias;
  if (pcVar9 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar9);
  }
  pSVar29->zName = (char *)0x0;
  pSVar10->a[iFrom].zAlias = (char *)0x0;
  local_118 = pSVar26->pPrior;
  if (local_118 != (Select *)0x0) {
    do {
      pEVar20 = p->pLimit;
      pEVar11 = p->pOrderBy;
      pSVar26 = p->pPrior;
      pTVar12 = pSVar10->a[iFrom].pSTab;
      pSVar10->a[iFrom].pSTab = (Table *)0x0;
      p->pLimit = (Expr *)0x0;
      p->pOrderBy = (ExprList *)0x0;
      p->pPrior = (Select *)0x0;
      pSVar18 = sqlite3SelectDup(db,p,0);
      p->pLimit = pEVar20;
      p->pOrderBy = pEVar11;
      p->op = 0x88;
      pSVar10->a[iFrom].pSTab = pTVar12;
      if (pSVar18 != (Select *)0x0) {
        uVar16 = pParse->nSelect + 1;
        pParse->nSelect = uVar16;
        pSVar18->selId = uVar16;
        if ((local_120 != (int *)0x0) && (db->mallocFailed == '\0')) {
          renumberCursors(pParse,pSVar18,iFrom,local_120);
        }
        pSVar18->pPrior = pSVar26;
        if (pSVar26 != (Select *)0x0) {
          pSVar26->pNext = pSVar18;
        }
        pSVar18->pNext = p;
        pSVar26 = pSVar18;
      }
      p->pPrior = pSVar26;
      local_118 = local_118->pPrior;
    } while (local_118 != (Select *)0x0);
  }
  if (local_120 != (int *)0x0) {
    sqlite3DbFreeNN(db,local_120);
  }
  if (db->mallocFailed == '\0') {
    pTVar12 = pSVar10->a[iFrom].pSTab;
    if (pTVar12 != (Table *)0x0) {
      if (pTVar12->nTabRef == 1) {
        pParse_00 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pParse_00 = pParse;
        }
        sqlite3ParserAddCleanup(pParse_00,sqlite3DeleteTableGeneric,pTVar12);
      }
      else {
        pTVar12->nTabRef = pTVar12->nTabRef - 1;
      }
      pSVar10->a[iFrom].pSTab = (Table *)0x0;
    }
    if (p != (Select *)0x0) {
      pSVar26 = p;
      pSVar19 = pSVar10;
      pSVar18 = local_e0;
      do {
        if (pSVar26 == p) {
          bVar5 = pSVar10->a[iFrom].fg.jointype;
        }
        else {
          bVar5 = 0;
        }
        bVar6 = pSVar19->a[iFrom].fg.jointype;
        pSVar13 = pSVar18->pSrc;
        uVar7 = pSVar13->nSrc;
        uVar24 = (ulong)uVar7;
        pSVar19 = pSVar26->pSrc;
        if ((int)uVar7 < 2) {
LAB_0018a372:
          iVar17 = pSVar13->a[0].iCursor;
          if (0 < (int)uVar7) {
            lVar30 = 0;
            do {
              if (((&pSVar19->a[iFrom].fg.field_0x2)[lVar30] & 8) != 0) {
                sqlite3IdListDelete(db,*(IdList **)((long)&pSVar19->a[iFrom].u3 + lVar30));
              }
              puVar25 = (undefined8 *)((long)&pSVar13->a[0].zName + lVar30);
              puVar27 = (undefined8 *)((long)&pSVar19->a[iFrom].zName + lVar30);
              for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
                *puVar27 = *puVar25;
                puVar25 = puVar25 + (ulong)bVar31 * -2 + 1;
                puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
              }
              puVar2 = &pSVar19->a[iFrom].fg.jointype + lVar30;
              *puVar2 = *puVar2 | bVar6 & 0x40;
              puVar25 = (undefined8 *)((long)&pSVar13->a[0].u2 + lVar30);
              *puVar25 = 0;
              puVar25[1] = 0;
              puVar25 = (undefined8 *)((long)&pSVar13->a[0].colUsed + lVar30);
              *puVar25 = 0;
              puVar25[1] = 0;
              puVar25 = (undefined8 *)((long)&pSVar13->a[0].pSTab + lVar30);
              *puVar25 = 0;
              puVar25[1] = 0;
              puVar25 = (undefined8 *)((long)&pSVar13->a[0].zName + lVar30);
              *puVar25 = 0;
              puVar25[1] = 0;
              *(undefined8 *)((long)&pSVar13->a[0].u4 + lVar30) = 0;
              lVar30 = lVar30 + 0x48;
            } while (uVar24 * 0x48 != lVar30);
          }
          pSVar19->a[iFrom].fg.jointype =
               bVar5 | bVar6 & 0x40 | pSVar19->a[iFrom].fg.jointype & 0x40;
          pEVar11 = pSVar18->pOrderBy;
          if ((pEVar11 != (ExprList *)0x0) && ((pSVar26->selFlags & 0x400000) == 0)) {
            if (0 < pEVar11->nExpr) {
              paVar22 = &pEVar11->a[0].u;
              lVar30 = 0;
              do {
                (paVar22->x).iOrderByCol = 0;
                lVar30 = lVar30 + 1;
                paVar22 = paVar22 + 6;
              } while (lVar30 < pEVar11->nExpr);
            }
            pSVar26->pOrderBy = pEVar11;
            pSVar18->pOrderBy = (ExprList *)0x0;
          }
          pEVar20 = pSVar18->pWhere;
          pSVar18->pWhere = (Expr *)0x0;
          if ((bVar4 & 0x60) != 0) {
            sqlite3SetJoinExpr(pEVar20,iVar17,1);
          }
          if (pEVar20 != (Expr *)0x0) {
            if (pSVar26->pWhere != (Expr *)0x0) {
              pEVar20 = sqlite3PExpr(pParse,0x2c,pEVar20,pSVar26->pWhere);
            }
            pSVar26->pWhere = pEVar20;
          }
          if (db->mallocFailed == '\0') {
            local_98.iNewTable = iVar17;
            local_98.iTable = iVar28;
            local_98._20_4_ = 0xaaaaaaaa;
            local_98.isOuterJoin = local_cc;
            local_98.pEList = pSVar18->pEList;
            pSVar14 = pSVar18;
            do {
              pSVar23 = pSVar14;
              pSVar14 = pSVar23->pPrior;
            } while (pSVar14 != (Select *)0x0);
            local_98.pCList = pSVar23->pEList;
            local_98.pParse = pParse;
            substSelect(&local_98,pSVar26,0);
          }
          pSVar26->selFlags = pSVar26->selFlags | pSVar18->selFlags & 0x100;
          if (pSVar18->pLimit != (Expr *)0x0) {
            pSVar26->pLimit = pSVar18->pLimit;
            pSVar18->pLimit = (Expr *)0x0;
          }
          bVar15 = true;
          if (0 < (int)uVar7) {
            pSVar29 = pSVar19->a + iFrom;
            do {
              recomputeColumnsUsed(pSVar26,pSVar29);
              pSVar29 = pSVar29 + 1;
              uVar24 = uVar24 - 1;
            } while (uVar24 != 0);
            bVar15 = true;
          }
        }
        else {
          pSVar19 = sqlite3SrcListEnlarge(pParse,pSVar19,uVar7 - 1,iFrom + 1);
          if (pSVar19 != (SrcList *)0x0) {
            pSVar26->pSrc = pSVar19;
            goto LAB_0018a372;
          }
          bVar15 = false;
          pSVar19 = (SrcList *)0x0;
        }
        if (!bVar15) break;
        pSVar26 = pSVar26->pPrior;
        pSVar18 = pSVar18->pPrior;
      } while (pSVar26 != (Select *)0x0);
    }
    local_68._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_48 = (undefined1 *)0x0;
    aStack_40.pNC = (NameContext *)0x0;
    local_68._8_8_ = agginfoPersistExprCb;
    local_68._16_8_ = sqlite3SelectWalkNoop;
    local_68._0_8_ = pParse;
    sqlite3WalkSelect((Walker *)local_68,local_e0);
    if (local_e0 != (Select *)0x0) {
      clearSelect(db,local_e0,1);
      iVar17 = 1;
      goto LAB_00189d9f;
    }
  }
  else {
    sqlite3SrcItemAttachSubquery(pParse,pSVar29,local_e0,0);
  }
  iVar17 = 1;
LAB_00189d9f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar17;
}

Assistant:

static int flattenSubquery(
  Parse *pParse,       /* Parsing context */
  Select *p,           /* The parent or outer SELECT statement */
  int iFrom,           /* Index in p->pSrc->a[] of the inner subquery */
  int isAgg            /* True if outer SELECT uses aggregate functions */
){
  const char *zSavedAuthContext = pParse->zAuthContext;
  Select *pParent;    /* Current UNION ALL term of the other query */
  Select *pSub;       /* The inner query or "subquery" */
  Select *pSub1;      /* Pointer to the rightmost select in sub-query */
  SrcList *pSrc;      /* The FROM clause of the outer query */
  SrcList *pSubSrc;   /* The FROM clause of the subquery */
  int iParent;        /* VDBE cursor number of the pSub result set temp table */
  int iNewParent = -1;/* Replacement table for iParent */
  int isOuterJoin = 0; /* True if pSub is the right side of a LEFT JOIN */
  int i;              /* Loop counter */
  Expr *pWhere;                    /* The WHERE clause */
  SrcItem *pSubitem;               /* The subquery */
  sqlite3 *db = pParse->db;
  Walker w;                        /* Walker to persist agginfo data */
  int *aCsrMap = 0;

  /* Check to see if flattening is permitted.  Return 0 if not.
  */
  assert( p!=0 );
  assert( p->pPrior==0 );
  if( OptimizationDisabled(db, SQLITE_QueryFlattener) ) return 0;
  pSrc = p->pSrc;
  assert( pSrc && iFrom>=0 && iFrom<pSrc->nSrc );
  pSubitem = &pSrc->a[iFrom];
  iParent = pSubitem->iCursor;
  assert( pSubitem->fg.isSubquery );
  pSub = pSubitem->u4.pSubq->pSelect;
  assert( pSub!=0 );

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->pWin || pSub->pWin ) return 0;                  /* Restriction (25) */
#endif

  pSubSrc = pSub->pSrc;
  assert( pSubSrc );
  /* Prior to version 3.1.2, when LIMIT and OFFSET had to be simple constants,
  ** not arbitrary expressions, we allowed some combining of LIMIT and OFFSET
  ** because they could be computed at compile-time.  But when LIMIT and OFFSET
  ** became arbitrary expressions, we were forced to add restrictions (13)
  ** and (14). */
  if( pSub->pLimit && p->pLimit ) return 0;              /* Restriction (13) */
  if( pSub->pLimit && pSub->pLimit->pRight ) return 0;   /* Restriction (14) */
  if( (p->selFlags & SF_Compound)!=0 && pSub->pLimit ){
    return 0;                                            /* Restriction (15) */
  }
  if( pSubSrc->nSrc==0 ) return 0;                       /* Restriction (7)  */
  if( pSub->selFlags & SF_Distinct ) return 0;           /* Restriction (4)  */
  if( pSub->pLimit && (pSrc->nSrc>1 || isAgg) ){
     return 0;         /* Restrictions (8)(9) */
  }
  if( p->pOrderBy && pSub->pOrderBy ){
     return 0;                                           /* Restriction (11) */
  }
  if( isAgg && pSub->pOrderBy ) return 0;                /* Restriction (16) */
  if( pSub->pLimit && p->pWhere ) return 0;              /* Restriction (19) */
  if( pSub->pLimit && (p->selFlags & SF_Distinct)!=0 ){
     return 0;         /* Restriction (21) */
  }
  if( pSub->selFlags & (SF_Recursive) ){
    return 0; /* Restrictions (22) */
  }

  /*
  ** If the subquery is the right operand of a LEFT JOIN, then the
  ** subquery may not be a join itself (3a). Example of why this is not
  ** allowed:
  **
  **         t1 LEFT OUTER JOIN (t2 JOIN t3)
  **
  ** If we flatten the above, we would get
  **
  **         (t1 LEFT OUTER JOIN t2) JOIN t3
  **
  ** which is not at all the same thing.
  **
  ** See also tickets #306, #350, and #3300.
  */
  if( (pSubitem->fg.jointype & (JT_OUTER|JT_LTORJ))!=0 ){
    if( pSubSrc->nSrc>1                        /* (3a) */
     || IsVirtual(pSubSrc->a[0].pSTab)         /* (3b) */
     || (p->selFlags & SF_Distinct)!=0         /* (3d) */
     || (pSubitem->fg.jointype & JT_RIGHT)!=0  /* (26) */
    ){
      return 0;
    }
    isOuterJoin = 1;
  }

  assert( pSubSrc->nSrc>0 );  /* True by restriction (7) */
  if( iFrom>0 && (pSubSrc->a[0].fg.jointype & JT_LTORJ)!=0 ){
    return 0;   /* Restriction (27a) */
  }

  /* Condition (28) is blocked by the caller */
  assert( !pSubitem->fg.isCte || pSubitem->u2.pCteUse->eM10d!=M10d_Yes );

  /* Restriction (17): If the sub-query is a compound SELECT, then it must
  ** use only the UNION ALL operator. And none of the simple select queries
  ** that make up the compound SELECT are allowed to be aggregate or distinct
  ** queries.
  */
  if( pSub->pPrior ){
    int ii;
    if( pSub->pOrderBy ){
      return 0;  /* Restriction (20) */
    }
    if( isAgg || (p->selFlags & SF_Distinct)!=0 || isOuterJoin>0 ){
      return 0; /* (17d1), (17d2), or (17f) */
    }
    for(pSub1=pSub; pSub1; pSub1=pSub1->pPrior){
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Distinct );
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Aggregate );
      assert( pSub->pSrc!=0 );
      assert( (pSub->selFlags & SF_Recursive)==0 );
      assert( pSub->pEList->nExpr==pSub1->pEList->nExpr );
      if( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))!=0    /* (17b) */
       || (pSub1->pPrior && pSub1->op!=TK_ALL)                 /* (17a) */
       || pSub1->pSrc->nSrc<1                                  /* (17c) */
#ifndef SQLITE_OMIT_WINDOWFUNC
       || pSub1->pWin                                          /* (17e) */
#endif
      ){
        return 0;
      }
      if( iFrom>0 && (pSub1->pSrc->a[0].fg.jointype & JT_LTORJ)!=0 ){
        /* Without this restriction, the JT_LTORJ flag would end up being
        ** omitted on left-hand tables of the right join that is being
        ** flattened. */
        return 0;   /* Restrictions (17g), (27b) */
      }
      testcase( pSub1->pSrc->nSrc>1 );
    }

    /* Restriction (18). */
    if( p->pOrderBy ){
      for(ii=0; ii<p->pOrderBy->nExpr; ii++){
        if( p->pOrderBy->a[ii].u.x.iOrderByCol==0 ) return 0;
      }
    }

    /* Restriction (23) */
    if( (p->selFlags & SF_Recursive) ) return 0;

    /* Restriction (17h) */
    if( compoundHasDifferentAffinities(pSub) ) return 0;

    if( pSrc->nSrc>1 ){
      if( pParse->nSelect>500 ) return 0;
      if( OptimizationDisabled(db, SQLITE_FlttnUnionAll) ) return 0;
      aCsrMap = sqlite3DbMallocZero(db, ((i64)pParse->nTab+1)*sizeof(int));
      if( aCsrMap ) aCsrMap[0] = pParse->nTab;
    }
  }

  /***** If we reach this point, flattening is permitted. *****/
  TREETRACE(0x4,pParse,p,("flatten %u.%p from term %d\n",
                   pSub->selId, pSub, iFrom));

  /* Authorize the subquery */
  pParse->zAuthContext = pSubitem->zName;
  TESTONLY(i =) sqlite3AuthCheck(pParse, SQLITE_SELECT, 0, 0, 0);
  testcase( i==SQLITE_DENY );
  pParse->zAuthContext = zSavedAuthContext;

  /* Delete the transient structures associated with the subquery */

  if( ALWAYS(pSubitem->fg.isSubquery) ){
    pSub1 = sqlite3SubqueryDetach(db, pSubitem);
  }else{
    pSub1 = 0;
  }
  assert( pSubitem->fg.isSubquery==0 );
  assert( pSubitem->fg.fixedSchema==0 );
  sqlite3DbFree(db, pSubitem->zName);
  sqlite3DbFree(db, pSubitem->zAlias);
  pSubitem->zName = 0;
  pSubitem->zAlias = 0;
  assert( pSubitem->fg.isUsing!=0 || pSubitem->u3.pOn==0 );

  /* If the sub-query is a compound SELECT statement, then (by restrictions
  ** 17 and 18 above) it must be a UNION ALL and the parent query must
  ** be of the form:
  **
  **     SELECT <expr-list> FROM (<sub-query>) <where-clause>
  **
  ** followed by any ORDER BY, LIMIT and/or OFFSET clauses. This block
  ** creates N-1 copies of the parent query without any ORDER BY, LIMIT or
  ** OFFSET clauses and joins them to the left-hand-side of the original
  ** using UNION ALL operators. In this case N is the number of simple
  ** select statements in the compound sub-query.
  **
  ** Example:
  **
  **     SELECT a+1 FROM (
  **        SELECT x FROM tab
  **        UNION ALL
  **        SELECT y FROM tab
  **        UNION ALL
  **        SELECT abs(z*2) FROM tab2
  **     ) WHERE a!=5 ORDER BY 1
  **
  ** Transformed into:
  **
  **     SELECT x+1 FROM tab WHERE x+1!=5
  **     UNION ALL
  **     SELECT y+1 FROM tab WHERE y+1!=5
  **     UNION ALL
  **     SELECT abs(z*2)+1 FROM tab2 WHERE abs(z*2)+1!=5
  **     ORDER BY 1
  **
  ** We call this the "compound-subquery flattening".
  */
  for(pSub=pSub->pPrior; pSub; pSub=pSub->pPrior){
    Select *pNew;
    ExprList *pOrderBy = p->pOrderBy;
    Expr *pLimit = p->pLimit;
    Select *pPrior = p->pPrior;
    Table *pItemTab = pSubitem->pSTab;
    pSubitem->pSTab = 0;
    p->pOrderBy = 0;
    p->pPrior = 0;
    p->pLimit = 0;
    pNew = sqlite3SelectDup(db, p, 0);
    p->pLimit = pLimit;
    p->pOrderBy = pOrderBy;
    p->op = TK_ALL;
    pSubitem->pSTab = pItemTab;
    if( pNew==0 ){
      p->pPrior = pPrior;
    }else{
      pNew->selId = ++pParse->nSelect;
      if( aCsrMap && ALWAYS(db->mallocFailed==0) ){
        renumberCursors(pParse, pNew, iFrom, aCsrMap);
      }
      pNew->pPrior = pPrior;
      if( pPrior ) pPrior->pNext = pNew;
      pNew->pNext = p;
      p->pPrior = pNew;
      TREETRACE(0x4,pParse,p,("compound-subquery flattener"
                              " creates %u as peer\n",pNew->selId));
    }
    assert( pSubitem->fg.isSubquery==0 );
  }
  sqlite3DbFree(db, aCsrMap);
  if( db->mallocFailed ){
    assert( pSubitem->fg.fixedSchema==0 );
    assert( pSubitem->fg.isSubquery==0 );
    assert( pSubitem->u4.zDatabase==0 );
    sqlite3SrcItemAttachSubquery(pParse, pSubitem, pSub1, 0);
    return 1;
  }

  /* Defer deleting the Table object associated with the
  ** subquery until code generation is
  ** complete, since there may still exist Expr.pTab entries that
  ** refer to the subquery even after flattening.  Ticket #3346.
  **
  ** pSubitem->pTab is always non-NULL by test restrictions and tests above.
  */
  if( ALWAYS(pSubitem->pSTab!=0) ){
    Table *pTabToDel = pSubitem->pSTab;
    if( pTabToDel->nTabRef==1 ){
      Parse *pToplevel = sqlite3ParseToplevel(pParse);
      sqlite3ParserAddCleanup(pToplevel, sqlite3DeleteTableGeneric, pTabToDel);
      testcase( pToplevel->earlyCleanup );
    }else{
      pTabToDel->nTabRef--;
    }
    pSubitem->pSTab = 0;
  }

  /* The following loop runs once for each term in a compound-subquery
  ** flattening (as described above).  If we are doing a different kind
  ** of flattening - a flattening other than a compound-subquery flattening -
  ** then this loop only runs once.
  **
  ** This loop moves all of the FROM elements of the subquery into the
  ** the FROM clause of the outer query.  Before doing this, remember
  ** the cursor number for the original outer query FROM element in
  ** iParent.  The iParent cursor will never be used.  Subsequent code
  ** will scan expressions looking for iParent references and replace
  ** those references with expressions that resolve to the subquery FROM
  ** elements we are now copying in.
  */
  pSub = pSub1;
  for(pParent=p; pParent; pParent=pParent->pPrior, pSub=pSub->pPrior){
    int nSubSrc;
    u8 jointype = 0;
    u8 ltorj = pSrc->a[iFrom].fg.jointype & JT_LTORJ;
    assert( pSub!=0 );
    pSubSrc = pSub->pSrc;     /* FROM clause of subquery */
    nSubSrc = pSubSrc->nSrc;  /* Number of terms in subquery FROM clause */
    pSrc = pParent->pSrc;     /* FROM clause of the outer query */

    if( pParent==p ){
      jointype = pSubitem->fg.jointype;     /* First time through the loop */
    }

    /* The subquery uses a single slot of the FROM clause of the outer
    ** query.  If the subquery has more than one element in its FROM clause,
    ** then expand the outer query to make space for it to hold all elements
    ** of the subquery.
    **
    ** Example:
    **
    **    SELECT * FROM tabA, (SELECT * FROM sub1, sub2), tabB;
    **
    ** The outer query has 3 slots in its FROM clause.  One slot of the
    ** outer query (the middle slot) is used by the subquery.  The next
    ** block of code will expand the outer query FROM clause to 4 slots.
    ** The middle slot is expanded to two slots in order to make space
    ** for the two elements in the FROM clause of the subquery.
    */
    if( nSubSrc>1 ){
      pSrc = sqlite3SrcListEnlarge(pParse, pSrc, nSubSrc-1,iFrom+1);
      if( pSrc==0 ) break;
      pParent->pSrc = pSrc;
    }

    /* Transfer the FROM clause terms from the subquery into the
    ** outer query.
    */
    iNewParent = pSubSrc->a[0].iCursor;
    for(i=0; i<nSubSrc; i++){
      SrcItem *pItem = &pSrc->a[i+iFrom];
      assert( pItem->fg.isTabFunc==0 );
      assert( pItem->fg.isSubquery
           || pItem->fg.fixedSchema
           || pItem->u4.zDatabase==0 );
      if( pItem->fg.isUsing ) sqlite3IdListDelete(db, pItem->u3.pUsing);
      *pItem = pSubSrc->a[i];
      pItem->fg.jointype |= ltorj;
      memset(&pSubSrc->a[i], 0, sizeof(pSubSrc->a[i]));
    }
    pSrc->a[iFrom].fg.jointype &= JT_LTORJ;
    pSrc->a[iFrom].fg.jointype |= jointype | ltorj;

    /* Now begin substituting subquery result set expressions for
    ** references to the iParent in the outer query.
    **
    ** Example:
    **
    **   SELECT a+5, b*10 FROM (SELECT x*3 AS a, y+10 AS b FROM t1) WHERE a>b;
    **   \                     \_____________ subquery __________/          /
    **    \_____________________ outer query ______________________________/
    **
    ** We look at every expression in the outer query and every place we see
    ** "a" we substitute "x*3" and every place we see "b" we substitute "y+10".
    */
    if( pSub->pOrderBy && (pParent->selFlags & SF_NoopOrderBy)==0 ){
      /* At this point, any non-zero iOrderByCol values indicate that the
      ** ORDER BY column expression is identical to the iOrderByCol'th
      ** expression returned by SELECT statement pSub. Since these values
      ** do not necessarily correspond to columns in SELECT statement pParent,
      ** zero them before transferring the ORDER BY clause.
      **
      ** Not doing this may cause an error if a subsequent call to this
      ** function attempts to flatten a compound sub-query into pParent
      ** (the only way this can happen is if the compound sub-query is
      ** currently part of pSub->pSrc). See ticket [d11a6e908f].  */
      ExprList *pOrderBy = pSub->pOrderBy;
      for(i=0; i<pOrderBy->nExpr; i++){
        pOrderBy->a[i].u.x.iOrderByCol = 0;
      }
      assert( pParent->pOrderBy==0 );
      pParent->pOrderBy = pOrderBy;
      pSub->pOrderBy = 0;
    }
    pWhere = pSub->pWhere;
    pSub->pWhere = 0;
    if( isOuterJoin>0 ){
      assert( pSubSrc->nSrc==1 );
      sqlite3SetJoinExpr(pWhere, iNewParent, EP_OuterON);
    }
    if( pWhere ){
      if( pParent->pWhere ){
        pParent->pWhere = sqlite3PExpr(pParse, TK_AND, pWhere, pParent->pWhere);
      }else{
        pParent->pWhere = pWhere;
      }
    }
    if( db->mallocFailed==0 ){
      SubstContext x;
      x.pParse = pParse;
      x.iTable = iParent;
      x.iNewTable = iNewParent;
      x.isOuterJoin = isOuterJoin;
      x.pEList = pSub->pEList;
      x.pCList = findLeftmostExprlist(pSub);
      substSelect(&x, pParent, 0);
    }

    /* The flattened query is a compound if either the inner or the
    ** outer query is a compound. */
    pParent->selFlags |= pSub->selFlags & SF_Compound;
    assert( (pSub->selFlags & SF_Distinct)==0 ); /* restriction (17b) */

    /*
    ** SELECT ... FROM (SELECT ... LIMIT a OFFSET b) LIMIT x OFFSET y;
    **
    ** One is tempted to try to add a and b to combine the limits.  But this
    ** does not work if either limit is negative.
    */
    if( pSub->pLimit ){
      pParent->pLimit = pSub->pLimit;
      pSub->pLimit = 0;
    }

    /* Recompute the SrcItem.colUsed masks for the flattened
    ** tables. */
    for(i=0; i<nSubSrc; i++){
      recomputeColumnsUsed(pParent, &pSrc->a[i+iFrom]);
    }
  }

  /* Finally, delete what is left of the subquery and return success.
  */
  sqlite3AggInfoPersistWalkerInit(&w, pParse);
  sqlite3WalkSelect(&w,pSub1);
  sqlite3SelectDelete(db, pSub1);

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x4 ){
    TREETRACE(0x4,pParse,p,("After flattening:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif

  return 1;
}